

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem_all.cc
# Opt level: O2

int pem_write_bio_RSA_PUBKEY_i2d(void *x,uchar **outp)

{
  int iVar1;
  int iVar2;
  EVP_PKEY *pkey;
  _Head_base<0UL,_evp_pkey_st_*,_false> _Stack_28;
  
  if (x == (void *)0x0) {
    iVar2 = 0;
  }
  else {
    pkey = EVP_PKEY_new();
    iVar2 = -1;
    _Stack_28._M_head_impl = (evp_pkey_st *)pkey;
    if (pkey != (EVP_PKEY *)0x0) {
      iVar1 = EVP_PKEY_set1_RSA(pkey,(rsa_st *)x);
      if (iVar1 != 0) {
        iVar2 = i2d_PUBKEY(pkey,outp);
      }
    }
    std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&_Stack_28);
  }
  return iVar2;
}

Assistant:

static DSA *pkey_get_dsa(EVP_PKEY *key, DSA **dsa) {
  DSA *dtmp;
  if (!key) {
    return NULL;
  }
  dtmp = EVP_PKEY_get1_DSA(key);
  EVP_PKEY_free(key);
  if (!dtmp) {
    return NULL;
  }
  if (dsa) {
    DSA_free(*dsa);
    *dsa = dtmp;
  }
  return dtmp;
}